

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O0

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,cmMakefile *mf)

{
  byte bVar1;
  string *psVar2;
  element_type *peVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar6;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  shared_ptr<cmDebugger::cmDebuggerVariables> local_a0 [2];
  allocator<char> local_79;
  string local_78;
  shared_ptr<cmDebugger::cmDebuggerVariables> local_58;
  cmMakefile *local_48;
  undefined1 local_32;
  cmMakefile *pcStack_30;
  anon_class_1_0_00000001_for_AppleSDKTypeString AppleSDKTypeString;
  cmMakefile *mf_local;
  string *psStack_20;
  bool supportsVariableType_local;
  string *name_local;
  shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager_local;
  shared_ptr<cmDebugger::cmDebuggerVariables> *variables;
  
  pcStack_30 = mf;
  mf_local._7_1_ = supportsVariableType;
  psStack_20 = name;
  name_local = (string *)variablesManager;
  variablesManager_local = (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this;
  if (mf == (cmMakefile *)0x0) {
    std::shared_ptr<cmDebugger::cmDebuggerVariables>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerVariables> *)this);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    local_32 = 0;
    local_48 = mf;
    std::
    make_shared<cmDebugger::cmDebuggerVariables,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&,cmDebugger::cmDebuggerVariablesHelper::CreateIfAny(std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool,cmMakefile*)::__0>
              ((shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variablesManager
               ,(bool *)name,(anon_class_16_2_3fba98cb *)((long)&mf_local + 7));
    peVar3 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    psVar2 = name_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ListFiles",&local_79);
    bVar1 = mf_local._7_1_;
    pvVar4 = cmMakefile::GetListFiles_abi_cxx11_(pcStack_30);
    CreateIfAny((cmDebuggerVariablesHelper *)&local_58,
                (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)psVar2,&local_78,
                (bool)(bVar1 & 1),pvVar4);
    cmDebuggerVariables::AddSubVariables(peVar3,&local_58);
    std::shared_ptr<cmDebugger::cmDebuggerVariables>::~shared_ptr(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    peVar3 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    psVar2 = name_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"OutputFiles",&local_c1);
    bVar1 = mf_local._7_1_;
    pvVar4 = cmMakefile::GetOutputFiles_abi_cxx11_(pcStack_30);
    CreateIfAny((cmDebuggerVariablesHelper *)local_a0,
                (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)psVar2,&local_c0,
                (bool)(bVar1 & 1),pvVar4);
    cmDebuggerVariables::AddSubVariables(peVar3,local_a0);
    std::shared_ptr<cmDebugger::cmDebuggerVariables>::~shared_ptr(local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    peVar3 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    cmDebuggerVariables::SetIgnoreEmptyStringEntries(peVar3,true);
    peVar3 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    cmMakefile::GetDirectoryId((cmDirectoryId *)&local_e8,pcStack_30);
    cmDebuggerVariables::SetValue(peVar3,&local_e8);
    cmDirectoryId::~cmDirectoryId((cmDirectoryId *)&local_e8);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar6.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType, cmMakefile* mf)
{
  if (mf == nullptr) {
    return {};
  }

  auto AppleSDKTypeString = [&](cmMakefile::AppleSDK sdk) {
    switch (sdk) {
      case cmMakefile::AppleSDK::MacOS:
        return "MacOS";
      case cmMakefile::AppleSDK::IPhoneOS:
        return "IPhoneOS";
      case cmMakefile::AppleSDK::IPhoneSimulator:
        return "IPhoneSimulator";
      case cmMakefile::AppleSDK::AppleTVOS:
        return "AppleTVOS";
      case cmMakefile::AppleSDK::AppleTVSimulator:
        return "AppleTVSimulator";
      default:
        return "Unknown";
    }
  };

  auto variables = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType, [=]() {
      std::vector<cmDebuggerVariableEntry> ret = {
        { "DefineFlags", mf->GetDefineFlags() },
        { "DirectoryId", mf->GetDirectoryId().String },
        { "IsRootMakefile", mf->IsRootMakefile() },
        { "HomeDirectory", mf->GetHomeDirectory() },
        { "HomeOutputDirectory", mf->GetHomeOutputDirectory() },
        { "CurrentSourceDirectory", mf->GetCurrentSourceDirectory() },
        { "CurrentBinaryDirectory", mf->GetCurrentBinaryDirectory() },
        { "PlatformIs32Bit", mf->PlatformIs32Bit() },
        { "PlatformIs64Bit", mf->PlatformIs64Bit() },
        { "PlatformIsx32", mf->PlatformIsx32() },
        { "AppleSDKType", AppleSDKTypeString(mf->GetAppleSDKType()) },
        { "PlatformIsAppleEmbedded", mf->PlatformIsAppleEmbedded() }
      };

      return ret;
    });

  variables->AddSubVariables(CreateIfAny(
    variablesManager, "ListFiles", supportsVariableType, mf->GetListFiles()));
  variables->AddSubVariables(CreateIfAny(variablesManager, "OutputFiles",
                                         supportsVariableType,
                                         mf->GetOutputFiles()));

  variables->SetIgnoreEmptyStringEntries(true);
  variables->SetValue(mf->GetDirectoryId().String);
  return variables;
}